

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledVerticalInstancer::DecoratorTiledVerticalInstancer
          (DecoratorTiledVerticalInstancer *this)

{
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorTiledVerticalInstancer *local_10;
  DecoratorTiledVerticalInstancer *this_local;
  
  local_10 = this;
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,3);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledVerticalInstancer_00816320;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"top-image",&local_31);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_30,false);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"bottom-image",&local_69)
  ;
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_68,false);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"center-image",&local_91)
  ;
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_90,false);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"decorator",&local_b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"top-image, center-image, bottom-image",&local_e1);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&local_b8,&local_e0,RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

DecoratorTiledVerticalInstancer::DecoratorTiledVerticalInstancer() : DecoratorTiledInstancer(3)
{
	RegisterTileProperty("top-image");
	RegisterTileProperty("bottom-image");
	RegisterTileProperty("center-image");
	RegisterShorthand("decorator", "top-image, center-image, bottom-image", ShorthandType::RecursiveCommaSeparated);
}